

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O2

void FAudio_INTERNAL_GenerateOutput(FAudio *audio,float *output)

{
  uint32_t *puVar1;
  uint64_t *puVar2;
  float fVar3;
  float fVar4;
  byte bVar5;
  ushort uVar6;
  uint32_t uVar7;
  code *pcVar8;
  FAudioSourceVoice *voice;
  FAudioVoiceCallback *pFVar9;
  FAudioBufferEntry *pFVar10;
  OnBufferEndFunc p_Var11;
  OnStreamEndFunc p_Var12;
  OnBufferStartFunc p_Var13;
  uint64_t uVar14;
  long lVar15;
  FAudioFilterState *filterState;
  uint32_t uVar16;
  FAudioWaveFormatEx *pFVar17;
  ulong uVar18;
  float **ppfVar19;
  FAudioFilterState *pafVar20;
  FAudioMasteringVoice *pFVar21;
  float *pfVar22;
  LinkedList **ppLVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  int iVar27;
  FAudioVoice **ppFVar28;
  FAudioBufferEntry **ppFVar29;
  uint uVar30;
  long lVar31;
  LinkedList *pLVar32;
  FAudio *audio_00;
  FAudioMutex mutex;
  FAudioVoice *pFVar33;
  uint uVar34;
  float *in_R9;
  FAudioBufferEntry *pFVar35;
  ulong uVar36;
  bool bVar37;
  float fVar38;
  FAudioFilterState *local_68;
  uint32_t totalSamples;
  undefined4 uStack_5c;
  LinkedList *local_58;
  uint32_t local_4c;
  FAudio *local_48;
  float *local_40;
  LinkedList **local_38;
  
  if (audio->active != '\0') {
    local_40 = output;
    FAudio_OPERATIONSET_Execute(audio);
    FAudio_PlatformLockMutex(audio->callbackLock);
    ppLVar23 = &audio->callbacks;
    local_38 = ppLVar23;
    while (pLVar32 = *ppLVar23, pLVar32 != (LinkedList *)0x0) {
      pcVar8 = *(code **)((long)pLVar32->entry + 0x10);
      if (pcVar8 != (code *)0x0) {
        (*pcVar8)();
      }
      ppLVar23 = &pLVar32->next;
    }
    FAudio_PlatformUnlockMutex(audio->callbackLock);
    pFVar21 = audio->master;
    pfVar22 = (pFVar21->field_19).mix.inputCache;
    if (pfVar22 == (float *)0x0) {
      (pFVar21->field_19).master.output = local_40;
    }
    else {
      (pFVar21->field_19).master.output = pfVar22;
      SDL_memset((audio->master->field_19).mix.inputCache,0,
                 (ulong)(audio->master->field_19).master.inputChannels * (ulong)audio->updateSize *
                 4);
    }
    FAudio_PlatformLockMutex(audio->sourceLock);
    ppLVar23 = &audio->sources;
    local_48 = audio;
    while (pLVar32 = *ppLVar23, pLVar32 != (LinkedList *)0x0) {
      voice = (FAudioSourceVoice *)pLVar32->entry;
      audio->processingSource = voice;
      FAudio_INTERNAL_FlushPendingBuffers(voice);
      pFVar33 = audio->processingSource;
      if ((pFVar33->field_19).src.active != '\0') {
        FAudio_PlatformLockMutex(pFVar33->sendLock);
        fVar3 = (pFVar33->field_19).src.resampleFreq;
        pFVar17 = (pFVar33->field_19).src.format;
        fVar4 = (pFVar33->field_19).src.freqRatio;
        fVar38 = (float)pFVar17->nSamplesPerSec * fVar4;
        if ((fVar3 != fVar38) || (NAN(fVar3) || NAN(fVar38))) {
          if ((pFVar33->sends).SendCount == 0) {
            ppFVar28 = &pFVar33->audio->master;
          }
          else {
            ppFVar28 = &((pFVar33->sends).pSends)->pOutputVoice;
          }
          fVar3 = (((float)pFVar17->nSamplesPerSec * fVar4) /
                  (float)*(uint *)((long)&(*ppFVar28)->field_19 +
                                  (ulong)((*ppFVar28)->type != FAUDIO_VOICE_MASTER) * 0x10 + 0x14))
                  * 4.2949673e+09 + 0.5;
          uVar25 = (ulong)fVar3;
          (pFVar33->field_19).src.resampleStep =
               (long)(fVar3 - 9.223372e+18) & (long)uVar25 >> 0x3f | uVar25;
          (pFVar33->field_19).src.resampleFreq = (float)pFVar17->nSamplesPerSec * fVar4;
        }
        if ((pFVar33->field_19).src.active == '\x02') {
          audio_00 = pFVar33->audio;
LAB_00116cb0:
          local_58 = pLVar32;
          FAudio_INTERNAL_ResizeResampleCache
                    (audio_00,(uint)pFVar17->nChannels * (pFVar33->field_19).src.resampleSamples);
          uVar26 = (pFVar33->field_19).src.resampleSamples;
          uVar36 = (ulong)uVar26;
          _totalSamples = CONCAT44(uStack_5c,uVar26);
          SDL_memset(pFVar33->audio->resampleCache,0,
                     (ulong)(((pFVar33->field_19).src.format)->nChannels * uVar26) << 2);
          local_68 = (FAudioFilterState *)pFVar33->audio->resampleCache;
LAB_001173a0:
          uVar26 = (uint)uVar36;
          if ((pFVar33->flags & 8) != 0) {
            FAudio_PlatformLockMutex(pFVar33->filterLock);
            FAudio_INTERNAL_FilterVoice
                      ((FAudio *)&pFVar33->filter,(FAudioFilterParameters *)pFVar33->filterState,
                       local_68,(float *)(uVar36 & 0xffffffff),
                       (uint)((pFVar33->field_19).src.format)->nChannels,(uint16_t)in_R9);
            FAudio_PlatformUnlockMutex(pFVar33->filterLock);
          }
          FAudio_PlatformLockMutex(pFVar33->effectLock);
          if ((pFVar33->effects).count != 0) {
            uVar34 = (pFVar33->field_19).src.resampleSamples;
            iVar27 = uVar34 - uVar26;
            if (uVar26 <= uVar34 && iVar27 != 0) {
              uVar34 = (uint)((pFVar33->field_19).src.format)->nChannels;
              SDL_memset(*local_68 + uVar26 * uVar34,0,(ulong)(iVar27 * uVar34) << 2);
              _totalSamples = CONCAT44(uStack_5c,(pFVar33->field_19).src.resampleSamples);
            }
            local_68 = (FAudioFilterState *)
                       FAudio_INTERNAL_ProcessEffectChain(pFVar33,*local_68,&totalSamples);
          }
          FAudio_PlatformUnlockMutex(pFVar33->effectLock);
          if ((pFVar33->sends).SendCount != 0) {
            FAudio_PlatformLockMutex(pFVar33->volumeLock);
            uVar25 = _totalSamples;
            uVar16 = totalSamples;
            lVar31 = 0;
            for (uVar36 = 0; uVar36 < (pFVar33->sends).SendCount; uVar36 = uVar36 + 1) {
              lVar15 = *(long *)((long)&((pFVar33->sends).pSends)->pOutputVoice + lVar31);
              bVar37 = *(int *)(lVar15 + 0xc) != 2;
              pafVar20 = *(FAudioFilterState **)(lVar15 + 200 + (ulong)bVar37 * 8);
              uVar26 = *(uint *)((ulong)bVar37 * 0x10 + 0xd8 + lVar15);
              in_R9 = pFVar33->mixCoefficients[uVar36];
              (*pFVar33->sendMix[uVar36])
                        (uVar16,pFVar33->outputChannels,uVar26,*local_68,*pafVar20,in_R9);
              if ((*(byte *)((long)&((pFVar33->sends).pSends)->Flags + lVar31) & 0x80) != 0) {
                FAudio_INTERNAL_FilterVoice
                          ((FAudio *)((long)&pFVar33->sendFilter->Type + lVar31),
                           (FAudioFilterParameters *)pFVar33->sendFilterState[uVar36],pafVar20,
                           (float *)(uVar25 & 0xffffffff),uVar26 & 0xffff,(uint16_t)in_R9);
              }
              lVar31 = lVar31 + 0xc;
            }
            mutex = pFVar33->volumeLock;
LAB_00117515:
            FAudio_PlatformUnlockMutex(mutex);
          }
          FAudio_PlatformUnlockMutex(pFVar33->sendLock);
          pLVar32 = local_58;
          audio = local_48;
        }
        else {
          uVar25 = (pFVar33->field_19).src.curBufferOffsetDec + 0xffffffff +
                   (ulong)(pFVar33->field_19).src.resampleSamples *
                   (pFVar33->field_19).src.resampleStep;
          uVar36 = uVar25 >> 0x20;
          pFVar9 = (pFVar33->field_19).src.callback;
          if ((pFVar9 != (FAudioVoiceCallback *)0x0) &&
             (pFVar9->OnVoiceProcessingPassStart != (OnVoiceProcessingPassStartFunc)0x0)) {
            FAudio_PlatformUnlockMutex(pFVar33->sendLock);
            FAudio_PlatformUnlockMutex(pFVar33->audio->sourceLock);
            pFVar9 = (pFVar33->field_19).src.callback;
            ppFVar29 = &(pFVar33->field_19).src.bufferList;
            uVar18 = uVar36;
            while( true ) {
              pFVar35 = *ppFVar29;
              if ((pFVar35 == (FAudioBufferEntry *)0x0) || (uVar26 = (uint)uVar18, uVar26 == 0))
              goto LAB_00116dcc;
              uVar16 = (pFVar35->buffer).LoopCount;
              if (uVar16 == 0) {
                uVar34 = ((pFVar35->buffer).PlayLength + (pFVar35->buffer).PlayBegin) -
                         (pFVar33->field_19).src.curBufferOffset;
              }
              else {
                uVar7 = (pFVar35->buffer).LoopLength;
                uVar34 = uVar7 + (pFVar35->buffer).LoopBegin;
                in_R9 = (float *)(ulong)uVar34;
                uVar34 = ~(pFVar33->field_19).src.curBufferOffset + uVar34 + uVar16 * uVar7 +
                         (pFVar35->buffer).PlayLength;
              }
              uVar18 = (ulong)(uVar26 - uVar34);
              if (uVar26 < uVar34) break;
              ppFVar29 = &pFVar35->next;
            }
            uVar18 = 0;
LAB_00116dcc:
            iVar27 = (int)uVar18;
            pFVar17 = (pFVar33->field_19).src.format;
            if (pFVar17->wFormatTag == 2) {
              iVar27 = ((int)(uVar18 / pFVar17[1].wFormatTag) + 1) -
                       (uint)((int)(uVar18 % (ulong)pFVar17[1].wFormatTag) == 0);
            }
            (*pFVar9->OnVoiceProcessingPassStart)(pFVar9,(uint)pFVar17->nBlockAlign * iVar27);
            FAudio_PlatformLockMutex(pFVar33->audio->sourceLock);
            FAudio_PlatformLockMutex(pFVar33->sendLock);
          }
          FAudio_PlatformLockMutex((pFVar33->field_19).src.bufferLock);
          pFVar35 = (pFVar33->field_19).src.bufferList;
          if (pFVar35 != (FAudioBufferEntry *)0x0) {
            uVar26 = 0;
            local_58 = pLVar32;
            while( true ) {
              uVar34 = (uint)(uVar25 >> 0x20);
              if ((uVar34 <= uVar26) || (pFVar35 == (FAudioBufferEntry *)0x0)) break;
              if ((pFVar33->field_19).src.newBuffer != '\0') {
                (pFVar33->field_19).src.newBuffer = '\0';
                pFVar9 = (pFVar33->field_19).src.callback;
                if ((pFVar9 != (FAudioVoiceCallback *)0x0) &&
                   (pFVar9->OnBufferStart != (OnBufferStartFunc)0x0)) {
                  FAudio_PlatformUnlockMutex(pFVar33->audio->sourceLock);
                  pFVar9 = (pFVar33->field_19).src.callback;
                  (*pFVar9->OnBufferStart)(pFVar9,(pFVar35->buffer).pContext);
                  FAudio_PlatformLockMutex(pFVar33->audio->sourceLock);
                }
              }
              uVar34 = uVar34 - uVar26;
              uVar18 = (ulong)((pFVar35->buffer).LoopCount != 0);
              uVar30 = ((&(pFVar35->buffer).PlayLength)[uVar18 * 2] +
                       (&(pFVar35->buffer).PlayBegin)[uVar18 * 2]) -
                       (pFVar33->field_19).src.curBufferOffset;
              uVar24 = uVar34;
              if (uVar30 < uVar34) {
                uVar24 = uVar30;
              }
              (*(pFVar33->field_19).src.decode)
                        (pFVar33,&pFVar35->buffer,
                         pFVar33->audio->decodeCache +
                         ((pFVar33->field_19).src.format)->nChannels * uVar26,uVar24);
              uVar26 = uVar26 + uVar24;
              puVar1 = &(pFVar33->field_19).src.curBufferOffset;
              *puVar1 = *puVar1 + uVar24;
              puVar2 = &(pFVar33->field_19).src.totalSamples;
              *puVar2 = *puVar2 + (ulong)uVar24;
              if (uVar30 < uVar34) {
                if ((pFVar35->buffer).LoopCount == 0) {
                  if (((pFVar35->buffer).Flags & 0x40) != 0) {
                    (pFVar33->field_19).src.curBufferOffsetDec = 0;
                    (pFVar33->field_19).src.totalSamples = 0;
                  }
                  pFVar10 = (pFVar33->field_19).src.bufferList;
                  pFVar35 = pFVar10->next;
                  (pFVar33->field_19).src.bufferList = pFVar35;
                  if (pFVar35 == (FAudioBufferEntry *)0x0) {
                    uVar6 = ((pFVar33->field_19).src.format)->nChannels;
                    SDL_memset(pFVar33->audio->decodeCache + uVar26 * uVar6,0,
                               (uVar36 - uVar26) * (ulong)uVar6 * 4);
                  }
                  else {
                    (pFVar33->field_19).src.curBufferOffset = (pFVar35->buffer).PlayBegin;
                  }
                  if ((pFVar33->field_19).src.callback != (FAudioVoiceCallback *)0x0) {
                    FAudio_PlatformUnlockMutex(pFVar33->audio->sourceLock);
                    pFVar9 = (pFVar33->field_19).src.callback;
                    p_Var11 = pFVar9->OnBufferEnd;
                    if (p_Var11 != (OnBufferEndFunc)0x0) {
                      (*p_Var11)(pFVar9,(pFVar10->buffer).pContext);
                    }
                    if (((pFVar10->buffer).Flags & 0x40) != 0) {
                      pFVar9 = (pFVar33->field_19).src.callback;
                      p_Var12 = pFVar9->OnStreamEnd;
                      if (p_Var12 != (OnStreamEndFunc)0x0) {
                        (*p_Var12)(pFVar9);
                      }
                    }
                    if (pFVar35 == (FAudioBufferEntry *)0x0) {
                      pFVar35 = (pFVar33->field_19).src.bufferList;
                      if (pFVar35 != (FAudioBufferEntry *)0x0) {
                        (pFVar33->field_19).src.curBufferOffset = (pFVar35->buffer).PlayBegin;
                        goto LAB_00117070;
                      }
                      pFVar35 = (FAudioBufferEntry *)0x0;
                    }
                    else {
LAB_00117070:
                      pFVar9 = (pFVar33->field_19).src.callback;
                      p_Var13 = pFVar9->OnBufferStart;
                      if (p_Var13 != (OnBufferStartFunc)0x0) {
                        (*p_Var13)(pFVar9,(pFVar35->buffer).pContext);
                      }
                    }
                    FAudio_PlatformLockMutex(pFVar33->audio->sourceLock);
                  }
                  (*pFVar33->audio->pFree)(pFVar10);
                }
                else {
                  (pFVar33->field_19).src.curBufferOffset = (pFVar35->buffer).LoopBegin;
                  uVar34 = (pFVar35->buffer).LoopCount;
                  if (uVar34 < 0xff) {
                    (pFVar35->buffer).LoopCount = uVar34 - 1;
                  }
                  pFVar9 = (pFVar33->field_19).src.callback;
                  if ((pFVar9 != (FAudioVoiceCallback *)0x0) &&
                     (pFVar9->OnLoopEnd != (OnLoopEndFunc)0x0)) {
                    FAudio_PlatformUnlockMutex(pFVar33->audio->sourceLock);
                    pFVar9 = (pFVar33->field_19).src.callback;
                    (*pFVar9->OnLoopEnd)(pFVar9,(pFVar35->buffer).pContext);
                    FAudio_PlatformLockMutex(pFVar33->audio->sourceLock);
                  }
                }
              }
            }
            if (pFVar35 == (FAudioBufferEntry *)0x0) {
              uVar34 = (uint)((pFVar33->field_19).src.format)->nChannels;
              pfVar22 = pFVar33->audio->decodeCache + uVar26 * uVar34;
              iVar27 = uVar34 << 3;
LAB_0011719b:
              SDL_memset(pfVar22,0,iVar27);
            }
            else {
              uVar25 = (ulong)((pFVar35->buffer).LoopCount != 0);
              uVar34 = ((&(pFVar35->buffer).PlayLength)[uVar25 * 2] +
                       (&(pFVar35->buffer).PlayBegin)[uVar25 * 2]) -
                       (pFVar33->field_19).src.curBufferOffset;
              uVar16 = 2;
              if (uVar34 < 2) {
                uVar16 = uVar34;
              }
              (*(pFVar33->field_19).src.decode)
                        (pFVar33,&pFVar35->buffer,
                         pFVar33->audio->decodeCache +
                         ((pFVar33->field_19).src.format)->nChannels * uVar26,uVar16);
              if (uVar34 < 2) {
                uVar24 = (uint)((pFVar33->field_19).src.format)->nChannels;
                pfVar22 = pFVar33->audio->decodeCache + uVar26 * uVar24;
                iVar27 = (uVar34 * -4 + 8) * uVar24;
                goto LAB_0011719b;
              }
            }
            if (((pFVar33->field_19).src.curBufferOffsetDec != 0) &&
               (uVar14 = (pFVar33->field_19).src.totalSamples, uVar14 != 0)) {
              (pFVar33->field_19).src.totalSamples = uVar14 - 1;
            }
            pFVar9 = (pFVar33->field_19).src.callback;
            if ((pFVar9 != (FAudioVoiceCallback *)0x0) &&
               (pFVar9->OnVoiceProcessingPassEnd != (OnVoiceProcessingPassEndFunc)0x0)) {
              FAudio_PlatformUnlockMutex((pFVar33->field_19).src.bufferLock);
              FAudio_PlatformUnlockMutex(pFVar33->sendLock);
              FAudio_PlatformUnlockMutex(pFVar33->audio->sourceLock);
              pFVar9 = (pFVar33->field_19).src.callback;
              (*pFVar9->OnVoiceProcessingPassEnd)(pFVar9);
              FAudio_PlatformLockMutex(pFVar33->audio->sourceLock);
              FAudio_PlatformLockMutex(pFVar33->sendLock);
              FAudio_PlatformLockMutex((pFVar33->field_19).src.bufferLock);
            }
            if (uVar26 != 0) {
              uVar25 = (pFVar33->field_19).src.resampleStep;
              uVar36 = (((ulong)uVar26 << 0x20 | 0xffffffff) -
                       (pFVar33->field_19).src.curBufferOffsetDec) / uVar25 + 2;
              uVar26 = (pFVar33->field_19).src.resampleSamples;
              if (uVar26 <= uVar36) {
                uVar36 = (ulong)uVar26;
              }
              if (uVar25 == 0x100000000) {
                ppfVar19 = &pFVar33->audio->decodeCache;
              }
              else {
                FAudio_INTERNAL_ResizeResampleCache
                          (pFVar33->audio,((pFVar33->field_19).src.format)->nChannels * uVar26);
                bVar5 = (byte)((pFVar33->field_19).src.format)->nChannels;
                in_R9 = (float *)(ulong)bVar5;
                (*(pFVar33->field_19).src.resample)
                          (pFVar33->audio->decodeCache,pFVar33->audio->resampleCache,
                           &(pFVar33->field_19).src.resampleOffset,
                           (pFVar33->field_19).src.resampleStep,uVar36,bVar5);
                ppfVar19 = &pFVar33->audio->resampleCache;
              }
              local_68 = (FAudioFilterState *)*ppfVar19;
              if ((pFVar33->field_19).src.bufferList == (FAudioBufferEntry *)0x0) {
                (pFVar33->field_19).src.curBufferOffsetDec = 0;
                uVar16 = 0;
LAB_00117387:
                (pFVar33->field_19).src.curBufferOffset = uVar16;
              }
              else {
                uVar26 = (pFVar33->field_19).master.inputChannels * (int)uVar36 +
                         (pFVar33->field_19).mix.inputChannels;
                *(ulong *)((long)&pFVar33->field_19 + 0x20) = (ulong)uVar26;
                if ((uVar26 != 0) && (uVar16 = (pFVar33->field_19).src.curBufferOffset, uVar16 != 0)
                   ) {
                  uVar16 = uVar16 - 1;
                  goto LAB_00117387;
                }
              }
              FAudio_PlatformUnlockMutex((pFVar33->field_19).src.bufferLock);
              _totalSamples = CONCAT44(uStack_5c,(int)uVar36);
              goto LAB_001173a0;
            }
            mutex = (pFVar33->field_19).src.bufferLock;
            goto LAB_00117515;
          }
          FAudio_PlatformUnlockMutex((pFVar33->field_19).src.bufferLock);
          if (((pFVar33->effects).count != 0) && ((pFVar33->effects).state != FAPO_BUFFER_SILENT)) {
            audio_00 = pFVar33->audio;
            pFVar17 = (pFVar33->field_19).src.format;
            goto LAB_00116cb0;
          }
          FAudio_PlatformUnlockMutex(pFVar33->sendLock);
          FAudio_PlatformUnlockMutex(pFVar33->audio->sourceLock);
          pFVar9 = (pFVar33->field_19).src.callback;
          if ((pFVar9 != (FAudioVoiceCallback *)0x0) &&
             (pFVar9->OnVoiceProcessingPassEnd != (OnVoiceProcessingPassEndFunc)0x0)) {
            (*pFVar9->OnVoiceProcessingPassEnd)(pFVar9);
          }
          FAudio_PlatformLockMutex(pFVar33->audio->sourceLock);
        }
        FAudio_INTERNAL_FlushPendingBuffers(audio->processingSource);
      }
      ppLVar23 = &pLVar32->next;
    }
    audio->processingSource = (FAudioSourceVoice *)0x0;
    FAudio_PlatformUnlockMutex(audio->sourceLock);
    FAudio_PlatformLockMutex(audio->submixLock);
    ppLVar23 = &audio->submixes;
    while (pLVar32 = *ppLVar23, pLVar32 != (LinkedList *)0x0) {
      pFVar33 = (FAudioVoice *)pLVar32->entry;
      _totalSamples = 0;
      FAudio_PlatformLockMutex(pFVar33->sendLock);
      if ((pFVar33->field_19).src.resampleStep == 0x100000000) {
        ppfVar19 = &(pFVar33->field_19).mix.inputCache;
      }
      else {
        FAudio_INTERNAL_ResizeResampleCache
                  (pFVar33->audio,
                   (pFVar33->field_19).mix.inputChannels * (pFVar33->field_19).src.resampleSamples);
        bVar5 = *(byte *)((long)&pFVar33->field_19 + 0x20);
        in_R9 = (float *)(ulong)bVar5;
        (*(pFVar33->field_19).mix.resample)
                  ((pFVar33->field_19).mix.inputCache,pFVar33->audio->resampleCache,
                   (uint64_t *)&totalSamples,(pFVar33->field_19).src.resampleStep,
                   (ulong)(pFVar33->field_19).src.resampleSamples,bVar5);
        ppfVar19 = &pFVar33->audio->resampleCache;
      }
      pafVar20 = (FAudioFilterState *)*ppfVar19;
      uVar16 = (pFVar33->field_19).mix.inputChannels;
      uVar26 = (pFVar33->field_19).src.resampleSamples * uVar16;
      fVar3 = pFVar33->volume;
      if ((fVar3 != 1.0) || (NAN(fVar3))) {
        (*FAudio_INTERNAL_Amplify)((float *)pafVar20,uVar26,fVar3);
        uVar16 = (pFVar33->field_19).mix.inputChannels;
      }
      pfVar22 = (float *)((ulong)uVar26 / (ulong)uVar16);
      local_4c = (uint32_t)pfVar22;
      if ((pFVar33->flags & 8) != 0) {
        FAudio_PlatformLockMutex(pFVar33->filterLock);
        FAudio_INTERNAL_FilterVoice
                  ((FAudio *)&pFVar33->filter,(FAudioFilterParameters *)pFVar33->filterState,
                   pafVar20,pfVar22,(uint)*(ushort *)((long)&pFVar33->field_19 + 0x20),
                   (uint16_t)in_R9);
        FAudio_PlatformUnlockMutex(pFVar33->filterLock);
      }
      FAudio_PlatformLockMutex(pFVar33->effectLock);
      if ((pFVar33->effects).count != 0) {
        pafVar20 = (FAudioFilterState *)
                   FAudio_INTERNAL_ProcessEffectChain(pFVar33,(float *)pafVar20,&local_4c);
      }
      FAudio_PlatformUnlockMutex(pFVar33->effectLock);
      if ((pFVar33->sends).SendCount != 0) {
        local_58 = pLVar32;
        FAudio_PlatformLockMutex(pFVar33->volumeLock);
        uVar16 = local_4c;
        lVar31 = 0;
        for (uVar25 = 0; uVar25 < (pFVar33->sends).SendCount; uVar25 = uVar25 + 1) {
          lVar15 = *(long *)((long)&((pFVar33->sends).pSends)->pOutputVoice + lVar31);
          bVar37 = *(int *)(lVar15 + 0xc) != 2;
          filterState = *(FAudioFilterState **)(lVar15 + 200 + (ulong)bVar37 * 8);
          uVar26 = *(uint *)((ulong)bVar37 * 0x10 + 0xd8 + lVar15);
          in_R9 = pFVar33->mixCoefficients[uVar25];
          (*pFVar33->sendMix[uVar25])
                    (uVar16,pFVar33->outputChannels,uVar26,*pafVar20,*filterState,in_R9);
          if ((*(byte *)((long)&((pFVar33->sends).pSends)->Flags + lVar31) & 0x80) != 0) {
            FAudio_INTERNAL_FilterVoice
                      ((FAudio *)((long)&pFVar33->sendFilter->Type + lVar31),
                       (FAudioFilterParameters *)pFVar33->sendFilterState[uVar25],filterState,
                       (float *)(ulong)uVar16,uVar26 & 0xffff,(uint16_t)in_R9);
          }
          lVar31 = lVar31 + 0xc;
        }
        FAudio_PlatformUnlockMutex(pFVar33->volumeLock);
        pLVar32 = local_58;
        audio = local_48;
      }
      FAudio_PlatformUnlockMutex(pFVar33->sendLock);
      SDL_memset((pFVar33->field_19).mix.inputCache,0,
                 (ulong)(pFVar33->field_19).src.decodeSamples << 2);
      ppLVar23 = &pLVar32->next;
    }
    FAudio_PlatformUnlockMutex(audio->submixLock);
    pFVar21 = audio->master;
    fVar3 = pFVar21->volume;
    if ((fVar3 != 1.0) || (NAN(fVar3))) {
      (*FAudio_INTERNAL_Amplify)
                ((pFVar21->field_19).master.output,
                 (pFVar21->field_19).master.inputChannels * audio->updateSize,fVar3);
      pFVar21 = audio->master;
    }
    FAudio_PlatformLockMutex(pFVar21->effectLock);
    pFVar33 = audio->master;
    if ((pFVar33->effects).count != 0) {
      _totalSamples = CONCAT44(uStack_5c,audio->updateSize);
      pfVar22 = FAudio_INTERNAL_ProcessEffectChain
                          (pFVar33,(pFVar33->field_19).master.output,&totalSamples);
      uVar16 = totalSamples;
      if (pfVar22 != local_40) {
        SDL_memcpy(local_40,pfVar22,(ulong)(audio->master->outputChannels * totalSamples) << 2);
      }
      pFVar33 = audio->master;
      uVar26 = audio->updateSize - uVar16;
      if (uVar16 <= audio->updateSize && uVar26 != 0) {
        SDL_memset(local_40 + uVar16 * pFVar33->outputChannels,0,(ulong)uVar26 << 2);
        pFVar33 = audio->master;
      }
    }
    FAudio_PlatformUnlockMutex(pFVar33->effectLock);
    FAudio_PlatformLockMutex(audio->callbackLock);
    ppLVar23 = local_38;
    while (pLVar32 = *ppLVar23, pLVar32 != (LinkedList *)0x0) {
      pcVar8 = *(code **)((long)pLVar32->entry + 8);
      if (pcVar8 != (code *)0x0) {
        (*pcVar8)();
      }
      ppLVar23 = &pLVar32->next;
    }
    FAudio_PlatformUnlockMutex(audio->callbackLock);
  }
  return;
}

Assistant:

static void FAUDIOCALL FAudio_INTERNAL_GenerateOutput(FAudio *audio, float *output)
{
	uint32_t totalSamples;
	LinkedList *list;
	float *effectOut;
	FAudioEngineCallback *callback;

	LOG_FUNC_ENTER(audio)
	if (!audio->active)
	{
		LOG_FUNC_EXIT(audio)
		return;
	}

	/* Apply any committed changes */
	FAudio_OPERATIONSET_Execute(audio);

	/* ProcessingPassStart callbacks */
	FAudio_PlatformLockMutex(audio->callbackLock);
	LOG_MUTEX_LOCK(audio, audio->callbackLock)
	list = audio->callbacks;
	while (list != NULL)
	{
		callback = (FAudioEngineCallback*) list->entry;
		if (callback->OnProcessingPassStart != NULL)
		{
			callback->OnProcessingPassStart(
				callback
			);
		}
		list = list->next;
	}
	FAudio_PlatformUnlockMutex(audio->callbackLock);
	LOG_MUTEX_UNLOCK(audio, audio->callbackLock)

	/* Writes to master will directly write to output, but ONLY if there
	 * isn't any channel-changing effect processing to do first.
	 */
	if (audio->master->master.effectCache != NULL)
	{
		audio->master->master.output = audio->master->master.effectCache;
		FAudio_zero(
			audio->master->master.effectCache,
			(
				sizeof(float) *
				audio->updateSize *
				audio->master->master.inputChannels
			)
		);
	}
	else
	{
		audio->master->master.output = output;
	}

	/* Mix sources */
	FAudio_PlatformLockMutex(audio->sourceLock);
	LOG_MUTEX_LOCK(audio, audio->sourceLock)
	list = audio->sources;
	while (list != NULL)
	{
		audio->processingSource = (FAudioSourceVoice*) list->entry;

		FAudio_INTERNAL_FlushPendingBuffers(audio->processingSource);
		if (audio->processingSource->src.active)
		{
			FAudio_INTERNAL_MixSource(audio->processingSource);
			FAudio_INTERNAL_FlushPendingBuffers(audio->processingSource);
		}

		list = list->next;
	}
	audio->processingSource = NULL;
	FAudio_PlatformUnlockMutex(audio->sourceLock);
	LOG_MUTEX_UNLOCK(audio, audio->sourceLock)

	/* Mix submixes, ordered by processing stage */
	FAudio_PlatformLockMutex(audio->submixLock);
	LOG_MUTEX_LOCK(audio, audio->submixLock)
	list = audio->submixes;
	while (list != NULL)
	{
		FAudio_INTERNAL_MixSubmix((FAudioSubmixVoice*) list->entry);
		list = list->next;
	}
	FAudio_PlatformUnlockMutex(audio->submixLock);
	LOG_MUTEX_UNLOCK(audio, audio->submixLock)

	/* Apply master volume */
	if (audio->master->volume != 1.0f)
	{
		FAudio_INTERNAL_Amplify(
			audio->master->master.output,
			audio->updateSize * audio->master->master.inputChannels,
			audio->master->volume
		);
	}

	/* Process master effect chain */
	FAudio_PlatformLockMutex(audio->master->effectLock);
	LOG_MUTEX_LOCK(audio, audio->master->effectLock)
	if (audio->master->effects.count > 0)
	{
		totalSamples = audio->updateSize;
		effectOut = FAudio_INTERNAL_ProcessEffectChain(
			audio->master,
			audio->master->master.output,
			&totalSamples
		);

		if (effectOut != output)
		{
			FAudio_memcpy(
				output,
				effectOut,
				totalSamples * audio->master->outputChannels * sizeof(float)
			);
		}
		if (totalSamples < audio->updateSize)
		{
			FAudio_zero(
				output + (totalSamples * audio->master->outputChannels),
				(audio->updateSize - totalSamples) * sizeof(float)
			);
		}
	}
	FAudio_PlatformUnlockMutex(audio->master->effectLock);
	LOG_MUTEX_UNLOCK(audio, audio->master->effectLock)

	/* OnProcessingPassEnd callbacks */
	FAudio_PlatformLockMutex(audio->callbackLock);
	LOG_MUTEX_LOCK(audio, audio->callbackLock)
	list = audio->callbacks;
	while (list != NULL)
	{
		callback = (FAudioEngineCallback*) list->entry;
		if (callback->OnProcessingPassEnd != NULL)
		{
			callback->OnProcessingPassEnd(
				callback
			);
		}
		list = list->next;
	}
	FAudio_PlatformUnlockMutex(audio->callbackLock);
	LOG_MUTEX_UNLOCK(audio, audio->callbackLock)

	LOG_FUNC_EXIT(audio)
}